

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::lerp
          (LightNodeImpl<embree::SceneGraph::AmbientLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long *plVar9;
  _func_int **pp_Var10;
  long *in_RDX;
  float fVar11;
  
  if (*in_RDX == 0) {
    plVar9 = (long *)0x0;
  }
  else {
    plVar9 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo);
  }
  if (plVar9 != (long *)0x0) {
    (**(code **)(*plVar9 + 0x10))(plVar9);
  }
  pp_Var10 = (_func_int **)alignedMalloc(0x90,0x10);
  fVar11 = 1.0 - f;
  fVar1 = *(float *)(plVar9 + 0x10);
  fVar2 = *(float *)((long)plVar9 + 0x84);
  fVar3 = *(float *)(plVar9 + 0x11);
  fVar4 = *(float *)((long)plVar9 + 0x8c);
  fVar5 = *(float *)&light1_in[0x10].ptr;
  fVar6 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar7 = *(float *)&light1_in[0x11].ptr;
  fVar8 = *(float *)((long)&light1_in[0x11].ptr + 4);
  pp_Var10[1] = (_func_int *)0x0;
  pp_Var10[2] = (_func_int *)(pp_Var10 + 4);
  pp_Var10[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var10 + 4) = 0;
  pp_Var10[6] = (_func_int *)(pp_Var10 + 8);
  pp_Var10[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var10 + 8) = 0;
  pp_Var10[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var10 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var10 + 0x5c) = 0xffffffff;
  pp_Var10[0xc] = (_func_int *)0x0;
  *pp_Var10 = (_func_int *)&PTR__Node_002cc800;
  *(undefined4 *)(pp_Var10 + 0xe) = 0;
  *(float *)(pp_Var10 + 0x10) = fVar11 * fVar5 + f * fVar1;
  *(float *)((long)pp_Var10 + 0x84) = fVar11 * fVar6 + f * fVar2;
  *(float *)(pp_Var10 + 0x11) = fVar11 * fVar7 + f * fVar3;
  *(float *)((long)pp_Var10 + 0x8c) = fVar11 * fVar8 + f * fVar4;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var10;
  LOCK();
  pp_Var10[1] = pp_Var10[1] + 1;
  UNLOCK();
  if (plVar9 != (long *)0x0) {
    (**(code **)(*plVar9 + 0x18))(plVar9);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }